

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModelCreationUtils.cpp
# Opt level: O2

NeuralNetwork * addSoftmaxLayer(Model *m,char *name,char *input,char *output)

{
  ulong uVar1;
  NeuralNetwork *pNVar2;
  NeuralNetworkLayer *this;
  undefined8 *puVar3;
  
  pNVar2 = CoreML::Specification::Model::_internal_mutable_neuralnetwork(m);
  this = google::protobuf::RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer>::Add
                   (&pNVar2->layers_);
  uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
  puVar3 = (undefined8 *)(uVar1 & 0xfffffffffffffffc);
  if ((uVar1 & 1) != 0) {
    puVar3 = (undefined8 *)*puVar3;
  }
  google::protobuf::internal::ArenaStringPtr::
  Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>(&this->name_,name,puVar3);
  CoreML::Specification::NeuralNetworkLayer::add_input(this,input);
  CoreML::Specification::NeuralNetworkLayer::add_output(this,output);
  CoreML::Specification::NeuralNetworkLayer::_internal_mutable_softmax(this);
  return pNVar2;
}

Assistant:

Specification::NeuralNetwork* addSoftmaxLayer(Specification::Model& m, const char *name,  const char *input, const char *output) {
    
    auto neuralNet = m.mutable_neuralnetwork();
    auto softmaxLayer = neuralNet->add_layers();
    
    softmaxLayer->set_name(name);
    softmaxLayer->add_input(input);
    softmaxLayer->add_output(output);
    softmaxLayer->mutable_softmax();
    
    return neuralNet;
}